

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O0

void __thiscall xmrig::CpuThreads::CpuThreads(CpuThreads *this,size_t count,uint32_t intensity)

{
  undefined4 in_EDX;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *in_RSI;
  undefined4 *in_RDI;
  size_t i;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *pvVar1;
  int64_t in_stack_ffffffffffffffd8;
  CpuThreads *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0xffffffffffffffff;
  std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::vector
            ((vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)0x202728);
  std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::reserve
            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  for (pvVar1 = (vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)0x0; pvVar1 < in_RSI;
      pvVar1 = (vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)
               ((long)&(pvVar1->
                       super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1)) {
    add(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(uint32_t)((ulong)pvVar1 >> 0x20));
  }
  return;
}

Assistant:

xmrig::CpuThreads::CpuThreads(size_t count, uint32_t intensity)
{
    m_data.reserve(count);

    for (size_t i = 0; i < count; ++i) {
        add(-1, intensity);
    }
}